

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileLED.cpp
# Opt level: O3

void __thiscall TileLED::followWire(TileLED *this,Direction direction,State state)

{
  TileLED *local_8;
  
  if (Board::endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      Board::endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = this;
    std::vector<TileLED*,std::allocator<TileLED*>>::_M_realloc_insert<TileLED*>
              ((vector<TileLED*,std::allocator<TileLED*>> *)&Board::endpointLEDs,
               (iterator)
               Board::endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl
               .super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *Board::endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
     super__Vector_impl_data._M_finish = this;
    Board::endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         Board::endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

void TileLED::followWire(Direction direction, State state) {
    Board::endpointLEDs.push_back(this);
}